

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::ActivationParams::ByteSizeLong(ActivationParams *this)

{
  uint32 uVar1;
  uint uVar2;
  size_t sStack_10;
  
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 0x47) {
    sStack_10 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::ActivationParametricSoftplus>
                          ((this->NonlinearityType_).parametricsoftplus_);
    goto LAB_004ed8cc;
  }
  if (uVar1 == 10) {
    ((this->NonlinearityType_).linear_)->alpha_ = 0.0;
    sStack_10 = 2;
    goto LAB_004ed8d0;
  }
  if (uVar1 == 0xf) {
    uVar2 = -(uint)(((this->NonlinearityType_).leakyrelu_)->alpha_ != 0.0) & 1;
    ((this->NonlinearityType_).leakyrelu_)->_cached_size_ = uVar2 * 5;
    sStack_10 = (ulong)uVar2 * 5 + 2;
    goto LAB_004ed8d0;
  }
  if (uVar1 == 0x14) {
LAB_004ed847:
    uVar2 = -(uint)(((this->NonlinearityType_).leakyrelu_)->alpha_ != 0.0) & 1;
    ((this->NonlinearityType_).leakyrelu_)->_cached_size_ = uVar2 * 5;
    sStack_10 = (ulong)uVar2 * 5 + 3;
    goto LAB_004ed8d0;
  }
  if (uVar1 == 0x19) {
    sStack_10 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::ActivationPReLU>
                          ((this->NonlinearityType_).prelu_);
LAB_004ed8cc:
    sStack_10 = sStack_10 + 2;
  }
  else {
    if (uVar1 != 0x1e) {
      if (uVar1 == 0x1f) {
        sStack_10 = google::protobuf::internal::WireFormatLite::
                    MessageSizeNoVirtual<CoreML::Specification::ActivationScaledTanh>
                              ((this->NonlinearityType_).scaledtanh_);
        goto LAB_004ed8cc;
      }
      if (uVar1 != 0x28) {
        if (uVar1 == 0x29) {
          sStack_10 = google::protobuf::internal::WireFormatLite::
                      MessageSizeNoVirtual<CoreML::Specification::ActivationSigmoidHard>
                                ((this->NonlinearityType_).sigmoidhard_);
          goto LAB_004ed8cc;
        }
        if (uVar1 == 0x32) goto LAB_004ed847;
        if ((uVar1 != 0x3c) && (uVar1 != 0x46)) {
          if (uVar1 == 5) {
            sStack_10 = google::protobuf::internal::WireFormatLite::
                        MessageSizeNoVirtual<CoreML::Specification::ActivationLinear>
                                  ((this->NonlinearityType_).linear_);
            sStack_10 = sStack_10 + 1;
          }
          else {
            sStack_10 = 0;
          }
          goto LAB_004ed8d0;
        }
      }
    }
    ((this->NonlinearityType_).linear_)->alpha_ = 0.0;
    sStack_10 = 3;
  }
LAB_004ed8d0:
  this->_cached_size_ = (int)sStack_10;
  return sStack_10;
}

Assistant:

size_t ActivationParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ActivationParams)
  size_t total_size = 0;

  switch (NonlinearityType_case()) {
    // .CoreML.Specification.ActivationLinear linear = 5;
    case kLinear: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.linear_);
      break;
    }
    // .CoreML.Specification.ActivationReLU ReLU = 10;
    case kReLU: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.relu_);
      break;
    }
    // .CoreML.Specification.ActivationLeakyReLU leakyReLU = 15;
    case kLeakyReLU: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.leakyrelu_);
      break;
    }
    // .CoreML.Specification.ActivationThresholdedReLU thresholdedReLU = 20;
    case kThresholdedReLU: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.thresholdedrelu_);
      break;
    }
    // .CoreML.Specification.ActivationPReLU PReLU = 25;
    case kPReLU: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.prelu_);
      break;
    }
    // .CoreML.Specification.ActivationTanh tanh = 30;
    case kTanh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.tanh_);
      break;
    }
    // .CoreML.Specification.ActivationScaledTanh scaledTanh = 31;
    case kScaledTanh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.scaledtanh_);
      break;
    }
    // .CoreML.Specification.ActivationSigmoid sigmoid = 40;
    case kSigmoid: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.sigmoid_);
      break;
    }
    // .CoreML.Specification.ActivationSigmoidHard sigmoidHard = 41;
    case kSigmoidHard: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.sigmoidhard_);
      break;
    }
    // .CoreML.Specification.ActivationELU ELU = 50;
    case kELU: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.elu_);
      break;
    }
    // .CoreML.Specification.ActivationSoftsign softsign = 60;
    case kSoftsign: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.softsign_);
      break;
    }
    // .CoreML.Specification.ActivationSoftplus softplus = 70;
    case kSoftplus: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.softplus_);
      break;
    }
    // .CoreML.Specification.ActivationParametricSoftplus parametricSoftplus = 71;
    case kParametricSoftplus: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.parametricsoftplus_);
      break;
    }
    case NONLINEARITYTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}